

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O2

URI * __thiscall URI::operator=(URI *this,char *uri)

{
  clear(this);
  std::__cxx11::string::assign((char *)&this->mFullString);
  parseString(this);
  return this;
}

Assistant:

const URI &URI::operator=( const char *uri ) 
{
	clear();
	mFullString = uri;
	parseString();
	return *this;
}